

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_point.cpp
# Opt level: O0

int createNode(lua_State *L)

{
  EmmyFacade *L_00;
  element_type *this;
  Arena<Variable> *this_00;
  Idx<Variable> IVar1;
  Idx<Variable> variable;
  Idx<Variable> idx;
  undefined1 local_30 [24];
  Arena<Variable> *arenaRef;
  lua_State *L_local;
  
  arenaRef = (Arena<Variable> *)L;
  L_00 = EmmyFacade::Get();
  EmmyFacade::GetDebugger((EmmyFacade *)local_30,(lua_State *)L_00);
  this = std::__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                   ((__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    local_30);
  this_00 = Debugger::GetVariableArena(this);
  std::shared_ptr<Debugger>::~shared_ptr((shared_ptr<Debugger> *)local_30);
  if (this_00 != (Arena<Variable> *)0x0) {
    local_30._16_8_ = this_00;
    IVar1 = Arena<Variable>::Alloc(this_00);
    variable._arena = IVar1._arena;
    variable._4_4_ = 0;
    variable.Raw = IVar1.Raw;
    pushVariable((lua_State *)arenaRef,variable);
  }
  L_local._4_4_ = (uint)(this_00 != (Arena<Variable> *)0x0);
  return L_local._4_4_;
}

Assistant:

int createNode(lua_State* L)
{
	auto arenaRef = EmmyFacade::Get().GetDebugger(L)->GetVariableArena();
	if (arenaRef)
	{
		auto idx = arenaRef->Alloc();
		pushVariable(L, idx);
		return 1;
	}
	else
	{
		return 0;
	}
}